

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

sunrealtype N_VWSqrSumMaskLocal_ManyVector(N_Vector x,N_Vector w,N_Vector id)

{
  long lVar1;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double dVar2;
  sunrealtype contrib;
  sunrealtype sum;
  sunindextype N;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_38;
  undefined8 local_28;
  
  local_38 = 0.0;
  for (local_28 = 0; local_28 < *(long *)*in_RDI; local_28 = local_28 + 1) {
    dVar2 = (double)N_VWrmsNormMask(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_28 * 8),
                                    *(undefined8 *)(*(long *)(*in_RSI + 0x10) + local_28 * 8),
                                    *(undefined8 *)(*(long *)(*in_RDX + 0x10) + local_28 * 8));
    lVar1 = N_VGetLength(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_28 * 8));
    local_38 = dVar2 * dVar2 * (double)lVar1 + local_38;
  }
  return local_38;
}

Assistant:

sunrealtype MVAPPEND(N_VWSqrSumMaskLocal)(N_Vector x, N_Vector w, N_Vector id)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i, N;
  sunrealtype sum, contrib;
#ifdef MANYVECTOR_BUILD_WITH_MPI
  int rank;
#endif

  /* initialize output*/
  sum = ZERO;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
#ifdef MANYVECTOR_BUILD_WITH_MPI

    /* check for nvwsqrsummasklocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvwsqrsummasklocal)
    {
      sum += N_VWSqrSumMaskLocal(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(w, i),
                                 MANYVECTOR_SUBVEC(id, i));
      SUNCheckLastErrNoRet();

      /* otherwise, call nvwrmsnormmask, and accumulate to overall sum on root task */
    }
    else
    {
      contrib = N_VWrmsNormMask(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(w, i),
                                MANYVECTOR_SUBVEC(id, i));
      SUNCheckLastErrNoRet();

      /* get this task's rank in subvector communicator (note: serial
         subvectors will result in rank==0) */
      rank = SubvectorMPIRank(MANYVECTOR_SUBVEC(x, i));
      if (rank < 0) { return (ZERO); }
      if (rank == 0)
      {
        N = N_VGetLength(MANYVECTOR_SUBVEC(x, i));
        SUNCheckLastErrNoRet();
        sum += (contrib * contrib * N);
      }
    }

#else

    /* accumulate subvector contribution to overall sum */
    contrib = N_VWrmsNormMask(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(w, i),
                              MANYVECTOR_SUBVEC(id, i));
    SUNCheckLastErrNoRet();
    N = N_VGetLength(MANYVECTOR_SUBVEC(x, i));
    SUNCheckLastErrNoRet();
    sum += (contrib * contrib * N);

#endif
  }

  return (sum);
}